

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  GridSOA *pGVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  uint uVar43;
  ulong *puVar44;
  ulong *puVar45;
  ulong uVar46;
  GridSOA *pGVar47;
  ulong uVar48;
  ulong uVar49;
  undefined4 uVar50;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar52 [16];
  float fVar51;
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar59;
  undefined1 auVar56 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined4 uVar97;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  GridSOA *local_c78;
  ulong local_c70;
  ulong local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  RTCFilterFunctionNArguments local_c10;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  GridSOA **local_b00;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  float local_aa0 [4];
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar50 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar100._4_4_ = uVar50;
  auVar100._0_4_ = uVar50;
  auVar100._8_4_ = uVar50;
  auVar100._12_4_ = uVar50;
  uVar50 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar104._4_4_ = uVar50;
  auVar104._0_4_ = uVar50;
  auVar104._8_4_ = uVar50;
  auVar104._12_4_ = uVar50;
  uVar50 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar106._4_4_ = uVar50;
  auVar106._0_4_ = uVar50;
  auVar106._8_4_ = uVar50;
  auVar106._12_4_ = uVar50;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar14 = fVar1 * 0.99999964;
  fVar79 = fVar2 * 0.99999964;
  fVar15 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar36 = (tray->tnear).field_0.i[k];
  auVar84._4_4_ = iVar36;
  auVar84._0_4_ = iVar36;
  auVar84._8_4_ = iVar36;
  auVar84._12_4_ = iVar36;
  iVar36 = (tray->tfar).field_0.i[k];
  auVar91._4_4_ = iVar36;
  auVar91._0_4_ = iVar36;
  auVar91._8_4_ = iVar36;
  auVar91._12_4_ = iVar36;
  iVar36 = 1 << ((uint)k & 0x1f);
  auVar53._4_4_ = iVar36;
  auVar53._0_4_ = iVar36;
  auVar53._8_4_ = iVar36;
  auVar53._12_4_ = iVar36;
  auVar53._16_4_ = iVar36;
  auVar53._20_4_ = iVar36;
  auVar53._24_4_ = iVar36;
  auVar53._28_4_ = iVar36;
  auVar54 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar53 = vpand_avx2(auVar53,auVar54);
  local_a00 = vpcmpeqd_avx2(auVar53,auVar54);
  puVar45 = local_7f8;
  fVar51 = fVar79;
  fVar82 = fVar79;
  fVar83 = fVar79;
  local_b70 = fVar79;
  fStack_b6c = fVar79;
  fStack_b68 = fVar79;
  fStack_b64 = fVar79;
  do {
    puVar44 = puVar45;
    if (puVar44 == &local_800) break;
    puVar45 = puVar44 + -1;
    uVar38 = puVar44[-1];
    do {
      if ((uVar38 & 8) == 0) {
        auVar17 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar49),auVar100);
        auVar52._0_4_ = fVar14 * auVar17._0_4_;
        auVar52._4_4_ = fVar14 * auVar17._4_4_;
        auVar52._8_4_ = fVar14 * auVar17._8_4_;
        auVar52._12_4_ = fVar14 * auVar17._12_4_;
        auVar17 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar46),auVar104);
        auVar63._0_4_ = fVar79 * auVar17._0_4_;
        auVar63._4_4_ = fVar51 * auVar17._4_4_;
        auVar63._8_4_ = fVar82 * auVar17._8_4_;
        auVar63._12_4_ = fVar83 * auVar17._12_4_;
        auVar17 = vmaxps_avx(auVar52,auVar63);
        auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar41),auVar106);
        auVar64._0_4_ = fVar15 * auVar52._0_4_;
        auVar64._4_4_ = fVar15 * auVar52._4_4_;
        auVar64._8_4_ = fVar15 * auVar52._8_4_;
        auVar64._12_4_ = fVar15 * auVar52._12_4_;
        auVar52 = vmaxps_avx(auVar64,auVar84);
        auVar17 = vmaxps_avx(auVar17,auVar52);
        auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar49 ^ 0x10)),auVar100);
        auVar65._0_4_ = fVar1 * auVar52._0_4_;
        auVar65._4_4_ = fVar1 * auVar52._4_4_;
        auVar65._8_4_ = fVar1 * auVar52._8_4_;
        auVar65._12_4_ = fVar1 * auVar52._12_4_;
        auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar46 ^ 0x10)),auVar104);
        auVar68._0_4_ = fVar2 * auVar52._0_4_;
        auVar68._4_4_ = fVar2 * auVar52._4_4_;
        auVar68._8_4_ = fVar2 * auVar52._8_4_;
        auVar68._12_4_ = fVar2 * auVar52._12_4_;
        auVar52 = vminps_avx(auVar65,auVar68);
        auVar63 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar41 ^ 0x10)),auVar106);
        auVar69._0_4_ = fVar3 * auVar63._0_4_;
        auVar69._4_4_ = fVar3 * auVar63._4_4_;
        auVar69._8_4_ = fVar3 * auVar63._8_4_;
        auVar69._12_4_ = fVar3 * auVar63._12_4_;
        auVar63 = vminps_avx(auVar69,auVar91);
        auVar52 = vminps_avx(auVar52,auVar63);
        auVar17 = vcmpps_avx(auVar17,auVar52,2);
        uVar50 = vmovmskps_avx(auVar17);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar50);
      }
      if ((uVar38 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar43 = 4;
        }
        else {
          uVar37 = uVar38 & 0xfffffffffffffff0;
          lVar42 = 0;
          for (uVar38 = unaff_R15; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar42 = lVar42 + 1;
          }
          uVar43 = 0;
          for (uVar40 = unaff_R15 - 1 & unaff_R15; uVar38 = *(ulong *)(uVar37 + lVar42 * 8),
              uVar40 != 0; uVar40 = uVar40 - 1 & uVar40) {
            *puVar45 = uVar38;
            puVar45 = puVar45 + 1;
            lVar42 = 0;
            for (uVar38 = uVar40; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              lVar42 = lVar42 + 1;
            }
          }
        }
      }
      else {
        uVar43 = 6;
      }
    } while (uVar43 == 0);
    if (uVar43 == 6) {
      if (((uint)uVar38 & 0xf) == 8) {
        pGVar39 = (pre->super_Precalculations).grid;
        uVar43 = *(uint *)(pGVar39 + 0xc);
        local_c70 = (ulong)uVar43;
        uVar5 = *(uint *)(pGVar39 + 0x10);
        local_c68 = (ulong)uVar5;
        uVar6 = *(uint *)(pGVar39 + 0x24);
        uVar38 = uVar38 >> 4;
        lVar42 = uVar38 * 4 + (ulong)uVar6;
        auVar17 = *(undefined1 (*) [16])(pGVar39 + local_c70 * 4 + lVar42 + 0x2c);
        auVar52 = auVar17;
        if (2 < local_c68) {
          auVar52 = *(undefined1 (*) [16])
                     (pGVar39 + local_c70 * 8 + uVar38 * 4 + (ulong)uVar6 + 0x2c);
        }
        auVar63 = *(undefined1 (*) [16])(pGVar39 + uVar38 * 4 + (ulong)uVar6 + 0x2c);
        if (local_c70 == 2) {
          auVar63 = vshufps_avx(auVar63,auVar63,0x54);
          auVar17 = vshufps_avx(auVar17,auVar17,0x54);
          auVar52 = vshufps_avx(auVar52,auVar52,0x54);
        }
        uVar38 = (ulong)*(uint *)(pGVar39 + 0x14);
        pGVar47 = pGVar39 + uVar38 * 4 + lVar42 + 0x2c;
        auVar64 = *(undefined1 (*) [16])(pGVar47 + local_c70 * 4);
        auVar65 = auVar64;
        if (2 < uVar5) {
          auVar65 = *(undefined1 (*) [16])(pGVar47 + local_c70 * 8);
        }
        auVar68 = *(undefined1 (*) [16])pGVar47;
        if (uVar43 == 2) {
          auVar68 = vshufps_avx(auVar68,auVar68,0x54);
          auVar64 = vshufps_avx(auVar64,auVar64,0x54);
          auVar65 = vshufps_avx(auVar65,auVar65,0x54);
        }
        pGVar47 = pGVar39 + uVar38 * 8 + lVar42 + 0x2c;
        auVar69 = *(undefined1 (*) [16])(pGVar47 + local_c70 * 4);
        auVar92 = auVar69;
        if (2 < uVar5) {
          auVar92 = *(undefined1 (*) [16])(pGVar47 + local_c70 * 8);
        }
        auVar94._16_16_ = auVar17;
        auVar94._0_16_ = auVar63;
        auVar54._16_16_ = auVar52;
        auVar54._0_16_ = auVar17;
        auVar103 = vunpcklps_avx(auVar94,auVar54);
        auVar53 = vshufps_avx(auVar94,auVar94,0xa5);
        auVar54 = vshufps_avx(auVar54,auVar54,0x94);
        auVar101._16_16_ = auVar64;
        auVar101._0_16_ = auVar68;
        auVar90._16_16_ = auVar65;
        auVar90._0_16_ = auVar64;
        auVar95 = vunpcklps_avx(auVar101,auVar90);
        auVar94 = vshufps_avx(auVar101,auVar101,0xa5);
        auVar90 = vshufps_avx(auVar90,auVar90,0x94);
        auVar17 = *(undefined1 (*) [16])pGVar47;
        if (uVar43 == 2) {
          auVar17 = vshufps_avx(auVar17,auVar17,0x54);
          auVar69 = vshufps_avx(auVar69,auVar69,0x54);
          auVar92 = vshufps_avx(auVar92,auVar92,0x54);
        }
        local_c78 = pGVar39 + uVar38 * 0xc + lVar42 + 0x2c;
        auVar102._16_16_ = auVar69;
        auVar102._0_16_ = auVar17;
        auVar85._16_16_ = auVar92;
        auVar85._0_16_ = auVar69;
        auVar99 = vunpcklps_avx(auVar102,auVar85);
        auVar101 = vshufps_avx(auVar102,auVar102,0xa5);
        local_bc0._4_4_ = *(uint *)(pGVar39 + 0x18);
        local_be0._4_4_ = *(undefined4 *)(pGVar39 + 0x1c);
        uVar50 = *(undefined4 *)(ray + k * 4);
        auVar105._4_4_ = uVar50;
        auVar105._0_4_ = uVar50;
        auVar105._8_4_ = uVar50;
        auVar105._12_4_ = uVar50;
        auVar105._16_4_ = uVar50;
        auVar105._20_4_ = uVar50;
        auVar105._24_4_ = uVar50;
        auVar105._28_4_ = uVar50;
        uVar50 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar107._4_4_ = uVar50;
        auVar107._0_4_ = uVar50;
        auVar107._8_4_ = uVar50;
        auVar107._12_4_ = uVar50;
        auVar107._16_4_ = uVar50;
        auVar107._20_4_ = uVar50;
        auVar107._24_4_ = uVar50;
        auVar107._28_4_ = uVar50;
        auVar16 = vshufps_avx(auVar85,auVar85,0x94);
        uVar50 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar111._4_4_ = uVar50;
        auVar111._0_4_ = uVar50;
        auVar111._8_4_ = uVar50;
        auVar111._12_4_ = uVar50;
        auVar111._16_4_ = uVar50;
        auVar111._20_4_ = uVar50;
        auVar111._24_4_ = uVar50;
        auVar111._28_4_ = uVar50;
        local_c60 = vsubps_avx(auVar103,auVar105);
        auVar103 = vsubps_avx(auVar95,auVar107);
        auVar95 = vsubps_avx(auVar99,auVar111);
        auVar53 = vsubps_avx(auVar53,auVar105);
        auVar94 = vsubps_avx(auVar94,auVar107);
        auVar101 = vsubps_avx(auVar101,auVar111);
        auVar54 = vsubps_avx(auVar54,auVar105);
        auVar90 = vsubps_avx(auVar90,auVar107);
        auVar16 = vsubps_avx(auVar16,auVar111);
        auVar99 = vsubps_avx(auVar54,local_c60);
        local_960 = vsubps_avx(auVar90,auVar103);
        local_940 = vsubps_avx(auVar16,auVar95);
        auVar66._0_4_ = auVar54._0_4_ + local_c60._0_4_;
        auVar66._4_4_ = auVar54._4_4_ + local_c60._4_4_;
        auVar66._8_4_ = auVar54._8_4_ + local_c60._8_4_;
        auVar66._12_4_ = auVar54._12_4_ + local_c60._12_4_;
        auVar66._16_4_ = auVar54._16_4_ + local_c60._16_4_;
        auVar66._20_4_ = auVar54._20_4_ + local_c60._20_4_;
        auVar66._24_4_ = auVar54._24_4_ + local_c60._24_4_;
        fVar57 = auVar54._28_4_;
        auVar66._28_4_ = fVar57 + local_c60._28_4_;
        auVar75._0_4_ = auVar90._0_4_ + auVar103._0_4_;
        auVar75._4_4_ = auVar90._4_4_ + auVar103._4_4_;
        auVar75._8_4_ = auVar90._8_4_ + auVar103._8_4_;
        auVar75._12_4_ = auVar90._12_4_ + auVar103._12_4_;
        auVar75._16_4_ = auVar90._16_4_ + auVar103._16_4_;
        auVar75._20_4_ = auVar90._20_4_ + auVar103._20_4_;
        auVar75._24_4_ = auVar90._24_4_ + auVar103._24_4_;
        fVar51 = auVar103._28_4_;
        auVar75._28_4_ = auVar90._28_4_ + fVar51;
        fVar112 = auVar95._0_4_;
        auVar86._0_4_ = fVar112 + auVar16._0_4_;
        fVar114 = auVar95._4_4_;
        auVar86._4_4_ = fVar114 + auVar16._4_4_;
        fVar116 = auVar95._8_4_;
        auVar86._8_4_ = fVar116 + auVar16._8_4_;
        fVar118 = auVar95._12_4_;
        auVar86._12_4_ = fVar118 + auVar16._12_4_;
        fVar120 = auVar95._16_4_;
        auVar86._16_4_ = fVar120 + auVar16._16_4_;
        fVar122 = auVar95._20_4_;
        auVar86._20_4_ = fVar122 + auVar16._20_4_;
        fVar124 = auVar95._24_4_;
        auVar86._24_4_ = fVar124 + auVar16._24_4_;
        auVar86._28_4_ = auVar95._28_4_ + auVar16._28_4_;
        auVar18._4_4_ = local_940._4_4_ * auVar75._4_4_;
        auVar18._0_4_ = local_940._0_4_ * auVar75._0_4_;
        auVar18._8_4_ = local_940._8_4_ * auVar75._8_4_;
        auVar18._12_4_ = local_940._12_4_ * auVar75._12_4_;
        auVar18._16_4_ = local_940._16_4_ * auVar75._16_4_;
        auVar18._20_4_ = local_940._20_4_ * auVar75._20_4_;
        auVar18._24_4_ = local_940._24_4_ * auVar75._24_4_;
        auVar18._28_4_ = uVar50;
        auVar52 = vfmsub231ps_fma(auVar18,local_960,auVar86);
        auVar19._4_4_ = auVar99._4_4_ * auVar86._4_4_;
        auVar19._0_4_ = auVar99._0_4_ * auVar86._0_4_;
        auVar19._8_4_ = auVar99._8_4_ * auVar86._8_4_;
        auVar19._12_4_ = auVar99._12_4_ * auVar86._12_4_;
        auVar19._16_4_ = auVar99._16_4_ * auVar86._16_4_;
        auVar19._20_4_ = auVar99._20_4_ * auVar86._20_4_;
        auVar19._24_4_ = auVar99._24_4_ * auVar86._24_4_;
        auVar19._28_4_ = auVar86._28_4_;
        auVar17 = vfmsub231ps_fma(auVar19,local_940,auVar66);
        auVar20._4_4_ = local_960._4_4_ * auVar66._4_4_;
        auVar20._0_4_ = local_960._0_4_ * auVar66._0_4_;
        auVar20._8_4_ = local_960._8_4_ * auVar66._8_4_;
        auVar20._12_4_ = local_960._12_4_ * auVar66._12_4_;
        auVar20._16_4_ = local_960._16_4_ * auVar66._16_4_;
        auVar20._20_4_ = local_960._20_4_ * auVar66._20_4_;
        auVar20._24_4_ = local_960._24_4_ * auVar66._24_4_;
        auVar20._28_4_ = auVar66._28_4_;
        auVar63 = vfmsub231ps_fma(auVar20,auVar99,auVar75);
        uVar50 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar108._4_4_ = uVar50;
        auVar108._0_4_ = uVar50;
        auVar108._8_4_ = uVar50;
        auVar108._12_4_ = uVar50;
        auVar108._16_4_ = uVar50;
        auVar108._20_4_ = uVar50;
        auVar108._24_4_ = uVar50;
        auVar108._28_4_ = uVar50;
        fVar79 = *(float *)(ray + k * 4 + 0xc0);
        auVar67._0_4_ = fVar79 * auVar63._0_4_;
        auVar67._4_4_ = fVar79 * auVar63._4_4_;
        auVar67._8_4_ = fVar79 * auVar63._8_4_;
        auVar67._12_4_ = fVar79 * auVar63._12_4_;
        auVar67._16_4_ = fVar79 * 0.0;
        auVar67._20_4_ = fVar79 * 0.0;
        auVar67._24_4_ = fVar79 * 0.0;
        auVar67._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar67,auVar108,ZEXT1632(auVar17));
        uVar50 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_c40._4_4_ = uVar50;
        local_c40._0_4_ = uVar50;
        local_c40._8_4_ = uVar50;
        local_c40._12_4_ = uVar50;
        local_c40._16_4_ = uVar50;
        local_c40._20_4_ = uVar50;
        local_c40._24_4_ = uVar50;
        local_c40._28_4_ = uVar50;
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_c40,ZEXT1632(auVar52));
        local_980 = vsubps_avx(auVar103,auVar94);
        local_9a0 = vsubps_avx(auVar95,auVar101);
        auVar76._0_4_ = auVar94._0_4_ + auVar103._0_4_;
        auVar76._4_4_ = auVar94._4_4_ + auVar103._4_4_;
        auVar76._8_4_ = auVar94._8_4_ + auVar103._8_4_;
        auVar76._12_4_ = auVar94._12_4_ + auVar103._12_4_;
        auVar76._16_4_ = auVar94._16_4_ + auVar103._16_4_;
        auVar76._20_4_ = auVar94._20_4_ + auVar103._20_4_;
        auVar76._24_4_ = auVar94._24_4_ + auVar103._24_4_;
        auVar76._28_4_ = auVar94._28_4_ + fVar51;
        auVar87._0_4_ = fVar112 + auVar101._0_4_;
        auVar87._4_4_ = fVar114 + auVar101._4_4_;
        auVar87._8_4_ = fVar116 + auVar101._8_4_;
        auVar87._12_4_ = fVar118 + auVar101._12_4_;
        auVar87._16_4_ = fVar120 + auVar101._16_4_;
        auVar87._20_4_ = fVar122 + auVar101._20_4_;
        auVar87._24_4_ = fVar124 + auVar101._24_4_;
        auVar87._28_4_ = auVar95._28_4_ + auVar101._28_4_;
        fVar82 = local_9a0._0_4_;
        fVar83 = local_9a0._4_4_;
        auVar95._4_4_ = auVar76._4_4_ * fVar83;
        auVar95._0_4_ = auVar76._0_4_ * fVar82;
        fVar9 = local_9a0._8_4_;
        auVar95._8_4_ = auVar76._8_4_ * fVar9;
        fVar10 = local_9a0._12_4_;
        auVar95._12_4_ = auVar76._12_4_ * fVar10;
        fVar11 = local_9a0._16_4_;
        auVar95._16_4_ = auVar76._16_4_ * fVar11;
        fVar12 = local_9a0._20_4_;
        auVar95._20_4_ = auVar76._20_4_ * fVar12;
        fVar13 = local_9a0._24_4_;
        auVar95._24_4_ = auVar76._24_4_ * fVar13;
        auVar95._28_4_ = fVar51;
        auVar63 = vfmsub231ps_fma(auVar95,local_980,auVar87);
        auVar95 = vsubps_avx(local_c60,auVar53);
        fVar113 = auVar95._0_4_;
        fVar115 = auVar95._4_4_;
        auVar21._4_4_ = fVar115 * auVar87._4_4_;
        auVar21._0_4_ = fVar113 * auVar87._0_4_;
        fVar117 = auVar95._8_4_;
        auVar21._8_4_ = fVar117 * auVar87._8_4_;
        fVar119 = auVar95._12_4_;
        auVar21._12_4_ = fVar119 * auVar87._12_4_;
        fVar121 = auVar95._16_4_;
        auVar21._16_4_ = fVar121 * auVar87._16_4_;
        fVar123 = auVar95._20_4_;
        auVar21._20_4_ = fVar123 * auVar87._20_4_;
        fVar125 = auVar95._24_4_;
        auVar21._24_4_ = fVar125 * auVar87._24_4_;
        auVar21._28_4_ = auVar99._28_4_;
        auVar88._0_4_ = auVar53._0_4_ + local_c60._0_4_;
        auVar88._4_4_ = auVar53._4_4_ + local_c60._4_4_;
        auVar88._8_4_ = auVar53._8_4_ + local_c60._8_4_;
        auVar88._12_4_ = auVar53._12_4_ + local_c60._12_4_;
        auVar88._16_4_ = auVar53._16_4_ + local_c60._16_4_;
        auVar88._20_4_ = auVar53._20_4_ + local_c60._20_4_;
        auVar88._24_4_ = auVar53._24_4_ + local_c60._24_4_;
        auVar88._28_4_ = auVar53._28_4_ + local_c60._28_4_;
        auVar52 = vfmsub231ps_fma(auVar21,local_9a0,auVar88);
        fVar126 = local_980._0_4_;
        fVar127 = local_980._4_4_;
        auVar22._4_4_ = fVar127 * auVar88._4_4_;
        auVar22._0_4_ = fVar126 * auVar88._0_4_;
        fVar128 = local_980._8_4_;
        auVar22._8_4_ = fVar128 * auVar88._8_4_;
        fVar129 = local_980._12_4_;
        auVar22._12_4_ = fVar129 * auVar88._12_4_;
        fVar130 = local_980._16_4_;
        auVar22._16_4_ = fVar130 * auVar88._16_4_;
        fVar131 = local_980._20_4_;
        auVar22._20_4_ = fVar131 * auVar88._20_4_;
        fVar132 = local_980._24_4_;
        auVar22._24_4_ = fVar132 * auVar88._24_4_;
        auVar22._28_4_ = auVar88._28_4_;
        auVar64 = vfmsub231ps_fma(auVar22,auVar95,auVar76);
        auVar89._0_4_ = fVar79 * auVar64._0_4_;
        auVar89._4_4_ = fVar79 * auVar64._4_4_;
        auVar89._8_4_ = fVar79 * auVar64._8_4_;
        auVar89._12_4_ = fVar79 * auVar64._12_4_;
        auVar89._16_4_ = fVar79 * 0.0;
        auVar89._20_4_ = fVar79 * 0.0;
        auVar89._24_4_ = fVar79 * 0.0;
        auVar89._28_4_ = 0;
        auVar52 = vfmadd231ps_fma(auVar89,auVar108,ZEXT1632(auVar52));
        auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),local_c40,ZEXT1632(auVar63));
        auVar18 = vsubps_avx(auVar53,auVar54);
        auVar70._0_4_ = auVar53._0_4_ + auVar54._0_4_;
        auVar70._4_4_ = auVar53._4_4_ + auVar54._4_4_;
        auVar70._8_4_ = auVar53._8_4_ + auVar54._8_4_;
        auVar70._12_4_ = auVar53._12_4_ + auVar54._12_4_;
        auVar70._16_4_ = auVar53._16_4_ + auVar54._16_4_;
        auVar70._20_4_ = auVar53._20_4_ + auVar54._20_4_;
        auVar70._24_4_ = auVar53._24_4_ + auVar54._24_4_;
        auVar70._28_4_ = auVar53._28_4_ + fVar57;
        auVar19 = vsubps_avx(auVar94,auVar90);
        auVar93._0_4_ = auVar94._0_4_ + auVar90._0_4_;
        auVar93._4_4_ = auVar94._4_4_ + auVar90._4_4_;
        auVar93._8_4_ = auVar94._8_4_ + auVar90._8_4_;
        auVar93._12_4_ = auVar94._12_4_ + auVar90._12_4_;
        auVar93._16_4_ = auVar94._16_4_ + auVar90._16_4_;
        auVar93._20_4_ = auVar94._20_4_ + auVar90._20_4_;
        auVar93._24_4_ = auVar94._24_4_ + auVar90._24_4_;
        auVar93._28_4_ = auVar94._28_4_ + auVar90._28_4_;
        auVar20 = vsubps_avx(auVar101,auVar16);
        auVar55._0_4_ = auVar101._0_4_ + auVar16._0_4_;
        auVar55._4_4_ = auVar101._4_4_ + auVar16._4_4_;
        auVar55._8_4_ = auVar101._8_4_ + auVar16._8_4_;
        auVar55._12_4_ = auVar101._12_4_ + auVar16._12_4_;
        auVar55._16_4_ = auVar101._16_4_ + auVar16._16_4_;
        auVar55._20_4_ = auVar101._20_4_ + auVar16._20_4_;
        auVar55._24_4_ = auVar101._24_4_ + auVar16._24_4_;
        auVar55._28_4_ = auVar101._28_4_ + auVar16._28_4_;
        auVar16._4_4_ = auVar20._4_4_ * auVar93._4_4_;
        auVar16._0_4_ = auVar20._0_4_ * auVar93._0_4_;
        auVar16._8_4_ = auVar20._8_4_ * auVar93._8_4_;
        auVar16._12_4_ = auVar20._12_4_ * auVar93._12_4_;
        auVar16._16_4_ = auVar20._16_4_ * auVar93._16_4_;
        auVar16._20_4_ = auVar20._20_4_ * auVar93._20_4_;
        auVar16._24_4_ = auVar20._24_4_ * auVar93._24_4_;
        auVar16._28_4_ = fVar57;
        auVar64 = vfmsub231ps_fma(auVar16,auVar19,auVar55);
        auVar23._4_4_ = auVar55._4_4_ * auVar18._4_4_;
        auVar23._0_4_ = auVar55._0_4_ * auVar18._0_4_;
        auVar23._8_4_ = auVar55._8_4_ * auVar18._8_4_;
        auVar23._12_4_ = auVar55._12_4_ * auVar18._12_4_;
        auVar23._16_4_ = auVar55._16_4_ * auVar18._16_4_;
        auVar23._20_4_ = auVar55._20_4_ * auVar18._20_4_;
        auVar23._24_4_ = auVar55._24_4_ * auVar18._24_4_;
        auVar23._28_4_ = auVar55._28_4_;
        auVar63 = vfmsub231ps_fma(auVar23,auVar20,auVar70);
        auVar24._4_4_ = auVar19._4_4_ * auVar70._4_4_;
        auVar24._0_4_ = auVar19._0_4_ * auVar70._0_4_;
        auVar24._8_4_ = auVar19._8_4_ * auVar70._8_4_;
        auVar24._12_4_ = auVar19._12_4_ * auVar70._12_4_;
        auVar24._16_4_ = auVar19._16_4_ * auVar70._16_4_;
        auVar24._20_4_ = auVar19._20_4_ * auVar70._20_4_;
        auVar24._24_4_ = auVar19._24_4_ * auVar70._24_4_;
        auVar24._28_4_ = auVar70._28_4_;
        auVar65 = vfmsub231ps_fma(auVar24,auVar18,auVar93);
        auVar71._0_4_ = fVar79 * auVar65._0_4_;
        auVar71._4_4_ = fVar79 * auVar65._4_4_;
        auVar71._8_4_ = fVar79 * auVar65._8_4_;
        auVar71._12_4_ = fVar79 * auVar65._12_4_;
        auVar71._16_4_ = fVar79 * 0.0;
        auVar71._20_4_ = fVar79 * 0.0;
        auVar71._24_4_ = fVar79 * 0.0;
        auVar71._28_4_ = 0;
        auVar63 = vfmadd231ps_fma(auVar71,auVar108,ZEXT1632(auVar63));
        auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),local_c40,ZEXT1632(auVar64));
        local_b20 = ZEXT1632(CONCAT412(auVar63._12_4_ + auVar17._12_4_ + auVar52._12_4_,
                                       CONCAT48(auVar63._8_4_ + auVar17._8_4_ + auVar52._8_4_,
                                                CONCAT44(auVar63._4_4_ +
                                                         auVar17._4_4_ + auVar52._4_4_,
                                                         auVar63._0_4_ +
                                                         auVar17._0_4_ + auVar52._0_4_))));
        auVar80._8_4_ = 0x7fffffff;
        auVar80._0_8_ = 0x7fffffff7fffffff;
        auVar80._12_4_ = 0x7fffffff;
        auVar80._16_4_ = 0x7fffffff;
        auVar80._20_4_ = 0x7fffffff;
        auVar80._24_4_ = 0x7fffffff;
        auVar80._28_4_ = 0x7fffffff;
        auVar53 = vandps_avx(local_b20,auVar80);
        fVar51 = auVar53._0_4_ * 1.1920929e-07;
        fVar57 = auVar53._4_4_ * 1.1920929e-07;
        auVar25._4_4_ = fVar57;
        auVar25._0_4_ = fVar51;
        fVar58 = auVar53._8_4_ * 1.1920929e-07;
        auVar25._8_4_ = fVar58;
        fVar59 = auVar53._12_4_ * 1.1920929e-07;
        auVar25._12_4_ = fVar59;
        fVar60 = auVar53._16_4_ * 1.1920929e-07;
        auVar25._16_4_ = fVar60;
        fVar61 = auVar53._20_4_ * 1.1920929e-07;
        auVar25._20_4_ = fVar61;
        fVar62 = auVar53._24_4_ * 1.1920929e-07;
        auVar25._24_4_ = fVar62;
        auVar25._28_4_ = auVar53._28_4_;
        local_9c0 = ZEXT1632(auVar17);
        auVar54 = vminps_avx(local_9c0,ZEXT1632(auVar52));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar63));
        auVar98._0_8_ = CONCAT44(fVar57,fVar51) ^ 0x8000000080000000;
        auVar98._8_4_ = -fVar58;
        auVar98._12_4_ = -fVar59;
        auVar98._16_4_ = -fVar60;
        auVar98._20_4_ = -fVar61;
        auVar98._24_4_ = -fVar62;
        auVar98._28_4_ = auVar53._28_4_ ^ 0x80000000;
        auVar53 = vcmpps_avx(auVar54,auVar98,5);
        auVar101 = local_9c0;
        local_b40 = ZEXT1632(auVar52);
        auVar94 = vmaxps_avx(local_9c0,local_b40);
        auVar54 = vmaxps_avx(auVar94,ZEXT1632(auVar63));
        auVar54 = vcmpps_avx(auVar54,auVar25,2);
        auVar90 = vorps_avx(auVar53,auVar54);
        if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar90 >> 0x7f,0) == '\0') &&
              (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar90 >> 0xbf,0) == '\0') &&
            (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar90[0x1f]) {
LAB_0060af5e:
          uVar37 = 0;
        }
        else {
          local_9e0 = local_b20;
          auVar26._4_4_ = fVar127 * local_940._4_4_;
          auVar26._0_4_ = fVar126 * local_940._0_4_;
          auVar26._8_4_ = fVar128 * local_940._8_4_;
          auVar26._12_4_ = fVar129 * local_940._12_4_;
          auVar26._16_4_ = fVar130 * local_940._16_4_;
          auVar26._20_4_ = fVar131 * local_940._20_4_;
          auVar26._24_4_ = fVar132 * local_940._24_4_;
          auVar26._28_4_ = auVar54._28_4_;
          auVar27._4_4_ = fVar115 * local_960._4_4_;
          auVar27._0_4_ = fVar113 * local_960._0_4_;
          auVar27._8_4_ = fVar117 * local_960._8_4_;
          auVar27._12_4_ = fVar119 * local_960._12_4_;
          auVar27._16_4_ = fVar121 * local_960._16_4_;
          auVar27._20_4_ = fVar123 * local_960._20_4_;
          auVar27._24_4_ = fVar125 * local_960._24_4_;
          auVar27._28_4_ = auVar53._28_4_;
          auVar63 = vfmsub213ps_fma(local_960,local_9a0,auVar26);
          auVar28._4_4_ = auVar19._4_4_ * fVar83;
          auVar28._0_4_ = auVar19._0_4_ * fVar82;
          auVar28._8_4_ = auVar19._8_4_ * fVar9;
          auVar28._12_4_ = auVar19._12_4_ * fVar10;
          auVar28._16_4_ = auVar19._16_4_ * fVar11;
          auVar28._20_4_ = auVar19._20_4_ * fVar12;
          auVar28._24_4_ = auVar19._24_4_ * fVar13;
          auVar28._28_4_ = auVar94._28_4_;
          auVar29._4_4_ = fVar115 * auVar20._4_4_;
          auVar29._0_4_ = fVar113 * auVar20._0_4_;
          auVar29._8_4_ = fVar117 * auVar20._8_4_;
          auVar29._12_4_ = fVar119 * auVar20._12_4_;
          auVar29._16_4_ = fVar121 * auVar20._16_4_;
          auVar29._20_4_ = fVar123 * auVar20._20_4_;
          auVar29._24_4_ = fVar125 * auVar20._24_4_;
          auVar29._28_4_ = 0;
          auVar64 = vfmsub213ps_fma(auVar20,local_980,auVar28);
          auVar53 = vandps_avx(auVar26,auVar80);
          auVar54 = vandps_avx(auVar28,auVar80);
          auVar53 = vcmpps_avx(auVar53,auVar54,1);
          local_a60 = vblendvps_avx(ZEXT1632(auVar64),ZEXT1632(auVar63),auVar53);
          auVar30._4_4_ = fVar127 * auVar18._4_4_;
          auVar30._0_4_ = fVar126 * auVar18._0_4_;
          auVar30._8_4_ = fVar128 * auVar18._8_4_;
          auVar30._12_4_ = fVar129 * auVar18._12_4_;
          auVar30._16_4_ = fVar130 * auVar18._16_4_;
          auVar30._20_4_ = fVar131 * auVar18._20_4_;
          auVar30._24_4_ = fVar132 * auVar18._24_4_;
          auVar30._28_4_ = auVar53._28_4_;
          auVar63 = vfmsub213ps_fma(auVar18,local_9a0,auVar29);
          auVar31._4_4_ = auVar99._4_4_ * fVar83;
          auVar31._0_4_ = auVar99._0_4_ * fVar82;
          auVar31._8_4_ = auVar99._8_4_ * fVar9;
          auVar31._12_4_ = auVar99._12_4_ * fVar10;
          auVar31._16_4_ = auVar99._16_4_ * fVar11;
          auVar31._20_4_ = auVar99._20_4_ * fVar12;
          auVar31._24_4_ = auVar99._24_4_ * fVar13;
          auVar31._28_4_ = auVar54._28_4_;
          auVar64 = vfmsub213ps_fma(local_940,auVar95,auVar31);
          auVar53 = vandps_avx(auVar31,auVar80);
          auVar54 = vandps_avx(auVar29,auVar80);
          auVar53 = vcmpps_avx(auVar53,auVar54,1);
          local_a40 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar64),auVar53);
          auVar63 = vfmsub213ps_fma(auVar99,local_980,auVar27);
          auVar64 = vfmsub213ps_fma(auVar19,auVar95,auVar30);
          auVar53 = vandps_avx(auVar27,auVar80);
          auVar54 = vandps_avx(auVar30,auVar80);
          auVar53 = vcmpps_avx(auVar53,auVar54,1);
          local_a20 = vblendvps_avx(ZEXT1632(auVar64),ZEXT1632(auVar63),auVar53);
          auVar63 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar99._4_4_ = local_a20._4_4_ * fVar79;
          auVar99._0_4_ = local_a20._0_4_ * fVar79;
          auVar99._8_4_ = local_a20._8_4_ * fVar79;
          auVar99._12_4_ = local_a20._12_4_ * fVar79;
          auVar99._16_4_ = local_a20._16_4_ * fVar79;
          auVar99._20_4_ = local_a20._20_4_ * fVar79;
          auVar99._24_4_ = local_a20._24_4_ * fVar79;
          auVar99._28_4_ = auVar90._28_4_;
          auVar64 = vfmadd213ps_fma(auVar108,local_a40,auVar99);
          auVar64 = vfmadd213ps_fma(local_c40,local_a60,ZEXT1632(auVar64));
          auVar94 = ZEXT1632(CONCAT412(auVar64._12_4_ + auVar64._12_4_,
                                       CONCAT48(auVar64._8_4_ + auVar64._8_4_,
                                                CONCAT44(auVar64._4_4_ + auVar64._4_4_,
                                                         auVar64._0_4_ + auVar64._0_4_))));
          auVar32._4_4_ = local_a20._4_4_ * fVar114;
          auVar32._0_4_ = local_a20._0_4_ * fVar112;
          auVar32._8_4_ = local_a20._8_4_ * fVar116;
          auVar32._12_4_ = local_a20._12_4_ * fVar118;
          auVar32._16_4_ = local_a20._16_4_ * fVar120;
          auVar32._20_4_ = local_a20._20_4_ * fVar122;
          auVar32._24_4_ = local_a20._24_4_ * fVar124;
          auVar32._28_4_ = auVar90._28_4_;
          auVar64 = vfmadd213ps_fma(auVar103,local_a40,auVar32);
          auVar65 = vfmadd213ps_fma(local_c60,local_a60,ZEXT1632(auVar64));
          auVar53 = vrcpps_avx(auVar94);
          auVar110._8_4_ = 0x3f800000;
          auVar110._0_8_ = &DAT_3f8000003f800000;
          auVar110._12_4_ = 0x3f800000;
          auVar110._16_4_ = 0x3f800000;
          auVar110._20_4_ = 0x3f800000;
          auVar110._24_4_ = 0x3f800000;
          auVar110._28_4_ = 0x3f800000;
          auVar64 = vfnmadd213ps_fma(auVar53,auVar94,auVar110);
          auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar53,auVar53);
          local_a80 = ZEXT1632(CONCAT412(auVar64._12_4_ * (auVar65._12_4_ + auVar65._12_4_),
                                         CONCAT48(auVar64._8_4_ * (auVar65._8_4_ + auVar65._8_4_),
                                                  CONCAT44(auVar64._4_4_ *
                                                           (auVar65._4_4_ + auVar65._4_4_),
                                                           auVar64._0_4_ *
                                                           (auVar65._0_4_ + auVar65._0_4_)))));
          uVar50 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar103._4_4_ = uVar50;
          auVar103._0_4_ = uVar50;
          auVar103._8_4_ = uVar50;
          auVar103._12_4_ = uVar50;
          auVar103._16_4_ = uVar50;
          auVar103._20_4_ = uVar50;
          auVar103._24_4_ = uVar50;
          auVar103._28_4_ = uVar50;
          uVar50 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar109._4_4_ = uVar50;
          auVar109._0_4_ = uVar50;
          auVar109._8_4_ = uVar50;
          auVar109._12_4_ = uVar50;
          auVar109._16_4_ = uVar50;
          auVar109._20_4_ = uVar50;
          auVar109._24_4_ = uVar50;
          auVar109._28_4_ = uVar50;
          auVar53 = vcmpps_avx(auVar103,local_a80,2);
          auVar54 = vcmpps_avx(local_a80,auVar109,2);
          auVar53 = vandps_avx(auVar53,auVar54);
          auVar64 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
          auVar63 = vpand_avx(auVar64,auVar63);
          auVar53 = vpmovsxwd_avx2(auVar63);
          if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar53 >> 0x7f,0) == '\0') &&
                (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar53 >> 0xbf,0) == '\0') &&
              (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar53[0x1f]) goto LAB_0060af5e;
          auVar53 = vcmpps_avx(auVar94,_DAT_02020f00,4);
          auVar64 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
          auVar63 = vpand_avx(auVar63,auVar64);
          local_ae0 = vpmovsxwd_avx2(auVar63);
          if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_ae0 >> 0x7f,0) == '\0') &&
                (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_ae0 >> 0xbf,0) == '\0') &&
              (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_ae0[0x1f]) {
LAB_0060aef1:
            uVar37 = 0;
          }
          else {
            local_9c0._0_8_ = auVar17._0_8_;
            local_9c0._8_8_ = auVar17._8_8_;
            local_b60 = local_9c0._0_8_;
            uStack_b58 = local_9c0._8_8_;
            uStack_b50 = 0;
            uStack_b48 = 0;
            local_b00 = &local_c78;
            pGVar7 = (context->scene->geometries).items[local_bc0._4_4_].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_0060aef1;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar37 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar54 = vrcpps_avx(local_b20);
              auVar53 = vandps_avx(local_b20,auVar80);
              auVar77._8_4_ = 0x219392ef;
              auVar77._0_8_ = 0x219392ef219392ef;
              auVar77._12_4_ = 0x219392ef;
              auVar77._16_4_ = 0x219392ef;
              auVar77._20_4_ = 0x219392ef;
              auVar77._24_4_ = 0x219392ef;
              auVar77._28_4_ = 0x219392ef;
              auVar53 = vcmpps_avx(auVar53,auVar77,5);
              auVar78._8_4_ = 0x3f800000;
              auVar78._0_8_ = &DAT_3f8000003f800000;
              auVar78._12_4_ = 0x3f800000;
              auVar78._16_4_ = 0x3f800000;
              auVar78._20_4_ = 0x3f800000;
              auVar78._24_4_ = 0x3f800000;
              auVar78._28_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_fma(local_b20,auVar54,auVar78);
              auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar54,auVar54);
              auVar53 = vandps_avx(auVar53,ZEXT1632(auVar63));
              auVar56._0_4_ = auVar53._0_4_ * auVar17._0_4_;
              auVar56._4_4_ = auVar53._4_4_ * auVar17._4_4_;
              auVar56._8_4_ = auVar53._8_4_ * auVar17._8_4_;
              auVar56._12_4_ = auVar53._12_4_ * auVar17._12_4_;
              auVar56._16_4_ = auVar53._16_4_ * 0.0;
              auVar56._20_4_ = auVar53._20_4_ * 0.0;
              auVar56._24_4_ = auVar53._24_4_ * 0.0;
              auVar56._28_4_ = 0;
              auVar54 = vminps_avx(auVar56,auVar78);
              auVar33._4_4_ = auVar53._4_4_ * auVar52._4_4_;
              auVar33._0_4_ = auVar53._0_4_ * auVar52._0_4_;
              auVar33._8_4_ = auVar53._8_4_ * auVar52._8_4_;
              auVar33._12_4_ = auVar53._12_4_ * auVar52._12_4_;
              auVar33._16_4_ = auVar53._16_4_ * 0.0;
              auVar33._20_4_ = auVar53._20_4_ * 0.0;
              auVar33._24_4_ = auVar53._24_4_ * 0.0;
              auVar33._28_4_ = auVar53._28_4_;
              auVar53 = vminps_avx(auVar33,auVar78);
              auVar17 = *(undefined1 (*) [16])(local_c78 + local_c70 * 4);
              auVar52 = auVar17;
              if (2 < local_c68) {
                auVar52 = *(undefined1 (*) [16])(local_c78 + local_c70 * 8);
              }
              auVar63 = *(undefined1 (*) [16])local_c78;
              if (local_c70 == 2) {
                auVar63 = vpshufd_avx(auVar63,0x54);
                auVar17 = vpshufd_avx(auVar17,0x54);
                auVar52 = vpshufd_avx(auVar52,0x54);
              }
              auVar81._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar63;
              auVar81._16_16_ = ZEXT116(1) * auVar17;
              auVar72._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar17;
              auVar72._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52
              ;
              auVar94 = vpunpckldq_avx2(auVar81,auVar72);
              auVar103 = vpshufd_avx2(auVar81,0xa5);
              auVar16 = vpshufd_avx2(auVar72,0x94);
              auVar90 = vpsrld_avx2(auVar94,0x10);
              auVar94 = vpblendw_avx2(auVar94,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar90 = vcvtdq2ps_avx(auVar90);
              auVar95 = vpsrld_avx2(auVar103,0x10);
              auVar103 = vpblendw_avx2(auVar103,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
              auVar103 = vcvtdq2ps_avx(auVar103);
              auVar95 = vcvtdq2ps_avx(auVar95);
              auVar99 = vpsrld_avx2(auVar16,0x10);
              auVar16 = vpblendw_avx2(auVar16,_DAT_02020f00,0xaa);
              auVar16 = vcvtdq2ps_avx(auVar16);
              auVar99 = vcvtdq2ps_avx(auVar99);
              auVar96._8_4_ = 0x3f800000;
              auVar96._0_8_ = &DAT_3f8000003f800000;
              auVar96._12_4_ = 0x3f800000;
              auVar96._16_4_ = 0x3f800000;
              auVar96._20_4_ = 0x3f800000;
              auVar96._24_4_ = 0x3f800000;
              auVar96._28_4_ = 0x3f800000;
              auVar18 = vsubps_avx(auVar96,auVar54);
              auVar18 = vsubps_avx(auVar18,auVar53);
              local_ac0._0_4_ =
                   auVar53._0_4_ * auVar16._0_4_ * 0.00012207031 +
                   auVar54._0_4_ * auVar103._0_4_ * 0.00012207031 +
                   auVar18._0_4_ * auVar94._0_4_ * 0.00012207031;
              local_ac0._4_4_ =
                   auVar53._4_4_ * auVar16._4_4_ * 0.00012207031 +
                   auVar54._4_4_ * auVar103._4_4_ * 0.00012207031 +
                   auVar18._4_4_ * auVar94._4_4_ * 0.00012207031;
              local_ac0._8_4_ =
                   auVar53._8_4_ * auVar16._8_4_ * 0.00012207031 +
                   auVar54._8_4_ * auVar103._8_4_ * 0.00012207031 +
                   auVar18._8_4_ * auVar94._8_4_ * 0.00012207031;
              local_ac0._12_4_ =
                   auVar53._12_4_ * auVar16._12_4_ * 0.00012207031 +
                   auVar54._12_4_ * auVar103._12_4_ * 0.00012207031 +
                   auVar18._12_4_ * auVar94._12_4_ * 0.00012207031;
              local_ac0._16_4_ =
                   auVar53._16_4_ * auVar16._16_4_ * 0.00012207031 +
                   auVar54._16_4_ * auVar103._16_4_ * 0.00012207031 +
                   auVar18._16_4_ * auVar94._16_4_ * 0.00012207031;
              local_ac0._20_4_ =
                   auVar53._20_4_ * auVar16._20_4_ * 0.00012207031 +
                   auVar54._20_4_ * auVar103._20_4_ * 0.00012207031 +
                   auVar18._20_4_ * auVar94._20_4_ * 0.00012207031;
              local_ac0._24_4_ =
                   auVar53._24_4_ * auVar16._24_4_ * 0.00012207031 +
                   auVar54._24_4_ * auVar103._24_4_ * 0.00012207031 +
                   auVar18._24_4_ * auVar94._24_4_ * 0.00012207031;
              local_ac0._28_4_ = auVar16._28_4_ + auVar103._28_4_ + auVar53._28_4_;
              local_aa0[1] = auVar53._4_4_ * auVar99._4_4_ * 0.00012207031 +
                             auVar54._4_4_ * auVar95._4_4_ * 0.00012207031 +
                             auVar18._4_4_ * auVar90._4_4_ * 0.00012207031;
              local_aa0[0] = auVar53._0_4_ * auVar99._0_4_ * 0.00012207031 +
                             auVar54._0_4_ * auVar95._0_4_ * 0.00012207031 +
                             auVar18._0_4_ * auVar90._0_4_ * 0.00012207031;
              local_aa0[2] = auVar53._8_4_ * auVar99._8_4_ * 0.00012207031 +
                             auVar54._8_4_ * auVar95._8_4_ * 0.00012207031 +
                             auVar18._8_4_ * auVar90._8_4_ * 0.00012207031;
              local_aa0[3] = auVar53._12_4_ * auVar99._12_4_ * 0.00012207031 +
                             auVar54._12_4_ * auVar95._12_4_ * 0.00012207031 +
                             auVar18._12_4_ * auVar90._12_4_ * 0.00012207031;
              fStack_a90 = auVar53._16_4_ * auVar99._16_4_ * 0.00012207031 +
                           auVar54._16_4_ * auVar95._16_4_ * 0.00012207031 +
                           auVar18._16_4_ * auVar90._16_4_ * 0.00012207031;
              fStack_a8c = auVar53._20_4_ * auVar99._20_4_ * 0.00012207031 +
                           auVar54._20_4_ * auVar95._20_4_ * 0.00012207031 +
                           auVar18._20_4_ * auVar90._20_4_ * 0.00012207031;
              fStack_a88 = auVar53._24_4_ * auVar99._24_4_ * 0.00012207031 +
                           auVar54._24_4_ * auVar95._24_4_ * 0.00012207031 +
                           auVar18._24_4_ * auVar90._24_4_ * 0.00012207031;
              fStack_a84 = auVar103._28_4_ + auVar95._28_4_ + auVar18._28_4_;
              iVar36 = vmovmskps_avx(local_ae0);
              uVar37 = CONCAT71((int7)((ulong)local_b00 >> 8),iVar36 != 0);
              if (iVar36 != 0) {
                uVar38 = 0;
                uVar48 = (ulong)(byte)iVar36;
                for (uVar40 = uVar48; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
                {
                  uVar38 = uVar38 + 1;
                }
                local_bc0._0_4_ = local_bc0._4_4_;
                uStack_bb8._0_4_ = local_bc0._4_4_;
                uStack_bb8._4_4_ = local_bc0._4_4_;
                uStack_bb0._0_4_ = local_bc0._4_4_;
                uStack_bb0._4_4_ = local_bc0._4_4_;
                uStack_ba8._0_4_ = local_bc0._4_4_;
                uStack_ba8._4_4_ = local_bc0._4_4_;
                local_be0._0_4_ = local_be0._4_4_;
                uStack_bd8._0_4_ = local_be0._4_4_;
                uStack_bd8._4_4_ = local_be0._4_4_;
                uStack_bd0._0_4_ = local_be0._4_4_;
                uStack_bd0._4_4_ = local_be0._4_4_;
                uStack_bc8._0_4_ = local_be0._4_4_;
                uStack_bc8._4_4_ = local_be0._4_4_;
                local_9c0 = auVar101;
                do {
                  uVar97 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_8c0 = *(undefined4 *)(local_ac0 + uVar38 * 4);
                  fVar79 = local_aa0[uVar38];
                  local_8a0._4_4_ = fVar79;
                  local_8a0._0_4_ = fVar79;
                  local_8a0._8_4_ = fVar79;
                  local_8a0._12_4_ = fVar79;
                  local_8a0._16_4_ = fVar79;
                  local_8a0._20_4_ = fVar79;
                  local_8a0._24_4_ = fVar79;
                  local_8a0._28_4_ = fVar79;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_a80 + uVar38 * 4);
                  uVar50 = *(undefined4 *)(local_a60 + uVar38 * 4);
                  auVar73._4_4_ = uVar50;
                  auVar73._0_4_ = uVar50;
                  auVar73._8_4_ = uVar50;
                  auVar73._12_4_ = uVar50;
                  auVar73._16_4_ = uVar50;
                  auVar73._20_4_ = uVar50;
                  auVar73._24_4_ = uVar50;
                  auVar73._28_4_ = uVar50;
                  uVar4 = *(undefined4 *)(local_a40 + uVar38 * 4);
                  local_900._4_4_ = uVar4;
                  local_900._0_4_ = uVar4;
                  local_900._8_4_ = uVar4;
                  local_900._12_4_ = uVar4;
                  local_900._16_4_ = uVar4;
                  local_900._20_4_ = uVar4;
                  local_900._24_4_ = uVar4;
                  local_900._28_4_ = uVar4;
                  local_8e0 = *(undefined4 *)(local_a20 + uVar38 * 4);
                  local_c10.context = context->user;
                  local_920[0] = (RTCHitN)(char)uVar50;
                  local_920[1] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar50;
                  local_920[5] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar50;
                  local_920[9] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar50;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar50;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar50;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar50;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar50;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar50 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar50 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar50 >> 0x18);
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  local_880 = local_be0;
                  uStack_878 = uStack_bd8;
                  uStack_870 = uStack_bd0;
                  uStack_868 = uStack_bc8;
                  local_860 = local_bc0;
                  uStack_858 = uStack_bb8;
                  uStack_850 = uStack_bb0;
                  uStack_848 = uStack_ba8;
                  auVar53 = vpcmpeqd_avx2(auVar73,auVar73);
                  uStack_83c = (local_c10.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_c10.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_ba0 = local_a00._0_8_;
                  uStack_b98 = local_a00._8_8_;
                  uStack_b90 = local_a00._16_8_;
                  uStack_b88 = local_a00._24_8_;
                  local_c10.valid = (int *)&local_ba0;
                  local_c10.geometryUserPtr = pGVar7->userPtr;
                  local_c10.hit = local_920;
                  local_c10.N = 8;
                  local_c10.ray = (RTCRayN *)ray;
                  if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_c40._0_4_ = (int)uVar37;
                    local_c60._0_4_ = uVar97;
                    auVar53 = ZEXT1632(auVar53._0_16_);
                    (*pGVar7->occlusionFilterN)(&local_c10);
                    uVar37 = (ulong)(uint)local_c40._0_4_;
                    auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
                    uVar97 = local_c60._0_4_;
                  }
                  auVar34._8_8_ = uStack_b98;
                  auVar34._0_8_ = local_ba0;
                  auVar34._16_8_ = uStack_b90;
                  auVar34._24_8_ = uStack_b88;
                  auVar94 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar34);
                  auVar54 = auVar53 & ~auVar94;
                  if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar54 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar54 >> 0x7f,0) == '\0') &&
                        (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar54 >> 0xbf,0) == '\0') &&
                      (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar54[0x1f]) {
                    auVar94 = auVar94 ^ auVar53;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      local_c40._0_4_ = (int)uVar37;
                      local_c60._0_4_ = uVar97;
                      auVar53 = ZEXT1632(auVar53._0_16_);
                      (*p_Var8)(&local_c10);
                      uVar37 = (ulong)(uint)local_c40._0_4_;
                      auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
                      uVar97 = local_c60._0_4_;
                    }
                    auVar35._8_8_ = uStack_b98;
                    auVar35._0_8_ = local_ba0;
                    auVar35._16_8_ = uStack_b90;
                    auVar35._24_8_ = uStack_b88;
                    auVar54 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar35);
                    auVar94 = auVar54 ^ auVar53;
                    auVar74._8_4_ = 0xff800000;
                    auVar74._0_8_ = 0xff800000ff800000;
                    auVar74._12_4_ = 0xff800000;
                    auVar74._16_4_ = 0xff800000;
                    auVar74._20_4_ = 0xff800000;
                    auVar74._24_4_ = 0xff800000;
                    auVar74._28_4_ = 0xff800000;
                    auVar53 = vblendvps_avx(auVar74,*(undefined1 (*) [32])(local_c10.ray + 0x100),
                                            auVar54);
                    *(undefined1 (*) [32])(local_c10.ray + 0x100) = auVar53;
                  }
                  if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar94 >> 0x7f,0) != '\0') ||
                        (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar94 >> 0xbf,0) != '\0') ||
                      (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar94[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar97;
                  uVar40 = uVar38 & 0x3f;
                  uVar38 = 0;
                  uVar48 = uVar48 ^ 1L << uVar40;
                  for (uVar40 = uVar48; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    uVar38 = uVar38 + 1;
                  }
                  uVar37 = CONCAT71((int7)(uVar37 >> 8),uVar48 != 0);
                } while (uVar48 != 0);
              }
            }
          }
        }
        uVar38 = 0;
        fVar79 = local_b70;
        fVar51 = fStack_b6c;
        fVar82 = fStack_b68;
        fVar83 = fStack_b64;
      }
      else {
        pGVar39 = (GridSOA *)(uVar38 & 0xfffffffffffffff0);
        uVar38 = *(ulong *)(pGVar39 + (ulong)*(uint *)(pGVar39 + 0x2c) + 0x30);
        (pre->super_Precalculations).grid = pGVar39;
        uVar37 = 0;
      }
      if ((uVar37 & 1) == 0) {
        uVar43 = 0;
        if (uVar38 != 0) {
          *puVar45 = uVar38;
          puVar45 = puVar45 + 1;
        }
      }
      else {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar43 = 1;
      }
    }
  } while ((uVar43 & 3) == 0);
  return puVar44 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }